

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O1

double matlab_std(double *x,int x_length)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = 0.0;
  dVar3 = 0.0;
  if (0 < x_length) {
    uVar1 = 0;
    do {
      dVar3 = dVar3 + x[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)x_length != uVar1);
  }
  if (0 < x_length) {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar4 = x[uVar1] - dVar3 / (double)x_length;
      dVar2 = dVar2 + dVar4 * dVar4;
      uVar1 = uVar1 + 1;
    } while ((uint)x_length != uVar1);
  }
  dVar2 = dVar2 / (double)(x_length + -1);
  if (0.0 <= dVar2) {
    return SQRT(dVar2);
  }
  dVar2 = sqrt(dVar2);
  return dVar2;
}

Assistant:

double matlab_std(const double *x, int x_length) {
  double average = 0.0;
  for (int i = 0; i < x_length; ++i) average += x[i];
  average /= x_length;

  double s = 0.0;
  for (int i = 0; i < x_length; ++i) s += pow(x[i] - average, 2.0);
  s /= (x_length - 1);

  return sqrt(s);
}